

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_change_cipher_spec(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  long lVar1;
  long *in_RSI;
  long in_RDI;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  int ret;
  size_t in_stack_ffffffffffffffb8;
  size_t len;
  void *in_stack_ffffffffffffffc0;
  void *src;
  ptls_buffer_t *in_stack_ffffffffffffffc8;
  long lVar2;
  long local_20;
  int local_14;
  
  if ((*(byte *)(in_RDI + 0x160) >> 2 & 1) == 0) {
    local_14 = 0;
  }
  else if ((code *)in_RSI[3] == begin_record_message) {
    local_14 = ptls_buffer__do_pushv
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8);
    if (local_14 == 0) {
      local_20 = 2;
      src = (void *)*in_RSI;
      len = 2;
      local_14 = ptls_buffer__do_pushv(in_stack_ffffffffffffffc8,src,2);
      if (local_14 == 0) {
        lVar2 = *(long *)(*in_RSI + 0x10);
        local_14 = ptls_buffer__do_pushv(in_stack_ffffffffffffffc8,src,len);
        if (local_14 == 0) {
          lVar1 = *(long *)(*in_RSI + 0x10);
          for (; local_20 != 0; local_20 = local_20 + -1) {
            *(char *)(*(long *)*in_RSI + (lVar2 - local_20)) =
                 (char)((ulong)(lVar1 - lVar2) >> (((char)local_20 + -1) * '\b' & 0x3fU));
          }
          *(byte *)(in_RDI + 0x160) = *(byte *)(in_RDI + 0x160) & 0xfb;
          local_14 = 0;
        }
      }
    }
  }
  else {
    local_14 = 10;
  }
  return local_14;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    /* check if we are requested to (or still need to) */
    if (!tls->send_change_cipher_spec) {
        ret = 0;
        goto Exit;
    }

    /* CCS is a record, can only be sent when using a record-based protocol. */
    if (emitter->begin_message != begin_record_message) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* emit CCS */
    buffer_push_record(emitter->buf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(emitter->buf, 1); });

    tls->send_change_cipher_spec = 0;
    ret = 0;
Exit:
    return ret;
}